

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O3

pair<slang::syntax::MacroActualArgumentListSyntax_*,_slang::parsing::Trivia> * __thiscall
slang::parsing::Preprocessor::handleTopLevelMacro
          (pair<slang::syntax::MacroActualArgumentListSyntax_*,_slang::parsing::Trivia>
           *__return_storage_ptr__,Preprocessor *this,Token directive)

{
  group_type_pointer pgVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  byte bVar5;
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens;
  undefined8 uVar6;
  value_type_pointer pbVar7;
  undefined1 __n [8];
  pointer __s1;
  bool bVar8;
  int iVar9;
  MacroActualArgumentListSyntax *pMVar10;
  DefineDirectiveSyntax *pDVar11;
  undefined4 extraout_var;
  ulong uVar13;
  uint64_t uVar14;
  Diagnostic *this_00;
  undefined4 extraout_var_00;
  EVP_PKEY_CTX *extraout_RDX;
  size_t extraout_RDX_00;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *src_00;
  __extent_storage<18446744073709551615UL> extraout_RDX_03;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  size_type __rlen;
  char cVar18;
  char cVar20;
  char cVar21;
  byte bVar22;
  undefined1 auVar19 [16];
  uchar uVar23;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  byte bVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  byte bVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  undefined1 auVar24 [16];
  byte bVar38;
  MacroDef MVar39;
  string_view sVar40;
  SourceRange range;
  Token TVar41;
  span<const_slang::parsing::Token,_18446744073709551615UL> tokens_00;
  size_t pos;
  value_type *elements;
  SmallSet<const_slang::syntax::DefineDirectiveSyntax_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
  alreadyExpanded;
  SmallVector<slang::parsing::Token,_32UL> buffer;
  DefineDirectiveSyntax *local_3a8;
  MacroIntrinsic local_3a0;
  undefined2 uStack_39c;
  undefined2 uStack_39a;
  Token local_398;
  ulong local_388;
  anon_union_12_4_39e54f29_for_Trivia_0 local_380;
  undefined1 local_370 [24];
  undefined8 local_358;
  uchar uStack_350;
  uchar uStack_34f;
  uchar uStack_34e;
  byte bStack_34d;
  uchar uStack_34c;
  uchar uStack_34b;
  uchar uStack_34a;
  byte bStack_349;
  size_t local_348;
  ulong local_340;
  group_type_pointer local_338;
  value_type_pointer local_330;
  undefined1 local_328 [64];
  Storage *local_2e8;
  Storage *local_2e0;
  undefined8 local_2d8;
  long local_2d0;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  char local_2a8;
  char cStack_2a7;
  char cStack_2a6;
  byte bStack_2a5;
  char cStack_2a4;
  char cStack_2a3;
  char cStack_2a2;
  byte bStack_2a1;
  char cStack_2a0;
  char cStack_29f;
  char cStack_29e;
  byte bStack_29d;
  char cStack_29c;
  char cStack_29b;
  char cStack_29a;
  byte bStack_299;
  uchar local_298;
  uchar uStack_297;
  uchar uStack_296;
  byte bStack_295;
  uchar uStack_294;
  uchar uStack_293;
  uchar uStack_292;
  byte bStack_291;
  uchar uStack_290;
  uchar uStack_28f;
  uchar uStack_28e;
  byte bStack_28d;
  uchar uStack_28c;
  uchar uStack_28b;
  uchar uStack_28a;
  byte bStack_289;
  undefined1 local_280 [8];
  span<const_slang::parsing::Token,_18446744073709551615UL> local_278;
  undefined1 local_268 [520];
  BumpAllocator *pBStack_60;
  undefined1 *local_58;
  Token local_50;
  char local_40 [16];
  Storage *pSVar12;
  
  local_278._M_extent._M_extent_value = (size_t)local_278._M_ptr;
  local_398._0_8_ = directive._0_8_;
  local_398.info = directive.info;
  MVar39 = findMacro(this,directive);
  local_3a8 = MVar39.syntax;
  local_3a0 = MVar39.intrinsic;
  uStack_39c = MVar39._12_2_;
  if (local_3a0 == None && local_3a8 == (DefineDirectiveSyntax *)0x0) {
    sVar40 = Token::valueText(&local_398);
    if (sVar40._M_len == 0) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",1,0)
      ;
    }
    local_280 = (undefined1  [8])(sVar40._M_len - 1);
    local_278._M_ptr = (pointer)(sVar40._M_str + 1);
    uVar14 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                        &(this->options).ignoreDirectives,
                        (basic_string_view<char,_std::char_traits<char>_> *)local_280);
    __n = local_280;
    uVar13 = uVar14 >> ((byte)(this->options).ignoreDirectives.table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                              .arrays.groups_size_index & 0x3f);
    local_338 = (this->options).ignoreDirectives.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                .arrays.groups_;
    lVar17 = (uVar14 & 0xff) * 4;
    uVar23 = (&UNK_004a938c)[lVar17];
    uVar25 = (&UNK_004a938d)[lVar17];
    uVar26 = (&UNK_004a938e)[lVar17];
    bVar22 = (&UNK_004a938f)[lVar17];
    local_330 = (this->options).ignoreDirectives.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                .arrays.elements_;
    __s1 = local_278._M_ptr;
    local_340 = (ulong)((uint)uVar14 & 7);
    local_348 = (this->options).ignoreDirectives.table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                .arrays.groups_size_mask;
    uVar16 = 0;
    uVar27 = uVar23;
    uVar28 = uVar25;
    uVar29 = uVar26;
    bVar30 = bVar22;
    uVar31 = uVar23;
    uVar32 = uVar25;
    uVar33 = uVar26;
    bVar34 = bVar22;
    uVar35 = uVar23;
    uVar36 = uVar25;
    uVar37 = uVar26;
    bVar38 = bVar22;
    do {
      pbVar7 = local_330;
      pgVar1 = local_338 + uVar13;
      local_298 = pgVar1->m[0].n;
      uStack_297 = pgVar1->m[1].n;
      uStack_296 = pgVar1->m[2].n;
      bStack_295 = pgVar1->m[3].n;
      uStack_294 = pgVar1->m[4].n;
      uStack_293 = pgVar1->m[5].n;
      uStack_292 = pgVar1->m[6].n;
      bStack_291 = pgVar1->m[7].n;
      uStack_290 = pgVar1->m[8].n;
      uStack_28f = pgVar1->m[9].n;
      uStack_28e = pgVar1->m[10].n;
      bStack_28d = pgVar1->m[0xb].n;
      uStack_28c = pgVar1->m[0xc].n;
      uStack_28b = pgVar1->m[0xd].n;
      uStack_28a = pgVar1->m[0xe].n;
      bVar5 = pgVar1->m[0xf].n;
      auVar19[0] = -(local_298 == uVar23);
      auVar19[1] = -(uStack_297 == uVar25);
      auVar19[2] = -(uStack_296 == uVar26);
      auVar19[3] = -(bStack_295 == bVar22);
      auVar19[4] = -(uStack_294 == uVar27);
      auVar19[5] = -(uStack_293 == uVar28);
      auVar19[6] = -(uStack_292 == uVar29);
      auVar19[7] = -(bStack_291 == bVar30);
      auVar19[8] = -(uStack_290 == uVar31);
      auVar19[9] = -(uStack_28f == uVar32);
      auVar19[10] = -(uStack_28e == uVar33);
      auVar19[0xb] = -(bStack_28d == bVar34);
      auVar19[0xc] = -(uStack_28c == uVar35);
      auVar19[0xd] = -(uStack_28b == uVar36);
      auVar19[0xe] = -(uStack_28a == uVar37);
      auVar19[0xf] = -(bVar5 == bVar38);
      uVar15 = (uint)(ushort)((ushort)(SUB161(auVar19 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar19 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar19 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar19 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar19 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar19 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar19 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar19 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar19 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar19 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar19 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar19 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar19 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar19 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar19 >> 0x77,0) & 1) << 0xe);
      local_388 = uVar13;
      bStack_289 = bVar5;
      if (uVar15 != 0) {
        local_358 = (MacroActualArgumentListSyntax *)
                    CONCAT17(bVar30,CONCAT16(uVar29,CONCAT15(uVar28,CONCAT14(uVar27,CONCAT13(bVar22,
                                                  CONCAT12(uVar26,CONCAT11(uVar25,uVar23)))))));
        uStack_350 = uVar31;
        uStack_34f = uVar32;
        uStack_34e = uVar33;
        bStack_34d = bVar34;
        uStack_34c = uVar35;
        uStack_34b = uVar36;
        uStack_34a = uVar37;
        bStack_349 = bVar38;
        do {
          iVar9 = 0;
          if (uVar15 != 0) {
            for (; (uVar15 >> iVar9 & 1) == 0; iVar9 = iVar9 + 1) {
            }
          }
          if (__n == (undefined1  [8])
                     *(Preprocessor **)
                      ((long)&pbVar7[uVar13 * 0xf]._M_len + (ulong)(uint)(iVar9 << 4))) {
            if (__n != (undefined1  [8])0x0) {
              iVar9 = bcmp(__s1,*(void **)((long)&pbVar7[uVar13 * 0xf]._M_str +
                                          (ulong)(uint)(iVar9 << 4)),(size_t)__n);
              uVar23 = (uchar)local_358;
              uVar25 = local_358._1_1_;
              uVar26 = local_358._2_1_;
              bVar22 = local_358._3_1_;
              uVar27 = local_358._4_1_;
              uVar28 = local_358._5_1_;
              uVar29 = local_358._6_1_;
              bVar30 = local_358._7_1_;
              uVar31 = uStack_350;
              uVar32 = uStack_34f;
              uVar33 = uStack_34e;
              bVar34 = bStack_34d;
              uVar35 = uStack_34c;
              uVar36 = uStack_34b;
              uVar37 = uStack_34a;
              bVar38 = bStack_349;
              if (iVar9 != 0) goto LAB_0020d493;
            }
            local_278 = (span<const_slang::parsing::Token,_18446744073709551615UL>)
                        (ZEXT816(4) << 0x40);
            local_280 = (undefined1  [8])local_268;
            goto LAB_0020d5b4;
          }
LAB_0020d493:
          uVar15 = uVar15 - 1 & uVar15;
        } while (uVar15 != 0);
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[local_340] & bVar5) == 0) break;
      lVar17 = local_388 + uVar16;
      uVar16 = uVar16 + 1;
      uVar13 = lVar17 + 1U & local_348;
    } while (uVar16 <= local_348);
    range = Token::range(&local_398);
    this_00 = addDiag(this,(DiagCode)0x1a0004,range);
    sVar40 = Token::valueText(&local_398);
    Diagnostic::operator<<(this_00,sVar40);
    TVar41 = peek(this);
    if (TVar41.kind == OpenParenthesis) {
      local_278._M_ptr = (pointer)0x0;
      local_278._M_extent._M_extent_value = 0;
      local_268._0_4_ = 0;
      TVar41.info = local_398.info;
      TVar41.kind = local_398.kind;
      TVar41._2_1_ = local_398._2_1_;
      TVar41.numFlags.raw = local_398.numFlags.raw;
      TVar41.rawLen = local_398.rawLen;
      local_280 = (undefined1  [8])this;
      pMVar10 = MacroParser::parseActualArgumentList((MacroParser *)local_280,TVar41);
      Trivia::Trivia(&__return_storage_ptr__->second);
      __return_storage_ptr__->first = pMVar10;
      return __return_storage_ptr__;
    }
LAB_0020d55d:
    Trivia::Trivia(&__return_storage_ptr__->second);
    __return_storage_ptr__->first = (MacroActualArgumentListSyntax *)0x0;
    return __return_storage_ptr__;
  }
  if (local_3a8 == (DefineDirectiveSyntax *)0x0) {
    pDVar11 = (DefineDirectiveSyntax *)0x0;
LAB_0020d071:
    pMVar10 = (MacroActualArgumentListSyntax *)0x0;
    local_50.info = directive.info;
    local_50._0_8_ = directive._0_8_;
  }
  else {
    pDVar11 = local_3a8;
    if (local_3a8->formalArguments == (MacroFormalArgumentListSyntax *)0x0) goto LAB_0020d071;
    local_278._M_ptr = (pointer)0x0;
    local_278._M_extent._M_extent_value = 0;
    local_268._0_4_ = 0;
    local_280 = (undefined1  [8])this;
    pMVar10 = MacroParser::parseActualArgumentList((MacroParser *)local_280,directive);
    pDVar11 = local_3a8;
    local_50.info = local_398.info;
    local_50._0_8_ = local_398._0_8_;
    if (pMVar10 == (MacroActualArgumentListSyntax *)0x0) goto LAB_0020d55d;
  }
  local_280 = (undefined1  [8])local_268;
  local_278 = (span<const_slang::parsing::Token,_18446744073709551615UL>)(ZEXT816(0x20) << 0x40);
  local_268._512_8_ = this->sourceManager;
  pBStack_60 = this->alloc;
  local_58 = local_280;
  local_40[0] = '\0';
  local_40[1] = '\x01';
  MVar39.builtIn = (bool)(undefined1)uStack_39c;
  MVar39.commandLine = (bool)uStack_39c._1_1_;
  MVar39.intrinsic = local_3a0;
  MVar39._14_2_ = uStack_39a;
  MVar39.syntax = pDVar11;
  bVar8 = expandMacro(this,MVar39,(MacroExpansion *)(local_268 + 0x200),pMVar10);
  if (bVar8) {
    local_2e8 = (Storage *)local_328;
    local_2d8 = 0x3f;
    local_2d0 = 1;
    local_2c8 = ZEXT816(0x4a92e0);
    local_2b8 = (undefined1  [16])0x0;
    src = extraout_RDX;
    local_358 = pMVar10;
    local_2e0 = local_2e8;
    if (local_3a0 == None) {
      auVar4._8_8_ = 0;
      auVar4._0_8_ = local_3a8;
      src = (EVP_PKEY_CTX *)
            (SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),8) ^
            SUB168(auVar4 * ZEXT816(0x9e3779b97f4a7c15),0));
      uVar13 = (ulong)src >> 0x3f;
      uVar2 = (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)::
                word)[(ulong)src & 0xff];
      uVar16 = 0;
      do {
        lVar17 = uVar13 * 0x10;
        local_2a8 = boost::unordered::detail::foa::
                    dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                    ::storage[lVar17];
        cStack_2a7 = boost::unordered::detail::foa::
                     dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                     ::storage[lVar17 + 1];
        cStack_2a6 = boost::unordered::detail::foa::
                     dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                     ::storage[lVar17 + 2];
        bStack_2a5 = boost::unordered::detail::foa::
                     dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                     ::storage[lVar17 + 3];
        cStack_2a4 = boost::unordered::detail::foa::
                     dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                     ::storage[lVar17 + 4];
        cStack_2a3 = boost::unordered::detail::foa::
                     dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                     ::storage[lVar17 + 5];
        cStack_2a2 = boost::unordered::detail::foa::
                     dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                     ::storage[lVar17 + 6];
        bStack_2a1 = boost::unordered::detail::foa::
                     dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                     ::storage[lVar17 + 7];
        cStack_2a0 = boost::unordered::detail::foa::
                     dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                     ::storage[lVar17 + 8];
        cStack_29f = boost::unordered::detail::foa::
                     dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                     ::storage[lVar17 + 9];
        cStack_29e = boost::unordered::detail::foa::
                     dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                     ::storage[lVar17 + 10];
        bStack_29d = boost::unordered::detail::foa::
                     dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                     ::storage[lVar17 + 0xb];
        cStack_29c = boost::unordered::detail::foa::
                     dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                     ::storage[lVar17 + 0xc];
        cStack_29b = boost::unordered::detail::foa::
                     dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                     ::storage[lVar17 + 0xd];
        cStack_29a = boost::unordered::detail::foa::
                     dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                     ::storage[lVar17 + 0xe];
        bStack_299 = boost::unordered::detail::foa::
                     dummy_groups<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,2ul>()
                     ::storage[lVar17 + 0xf];
        cVar18 = (char)uVar2;
        auVar24[0] = -(local_2a8 == cVar18);
        cVar20 = (char)((uint)uVar2 >> 8);
        auVar24[1] = -(cStack_2a7 == cVar20);
        cVar21 = (char)((uint)uVar2 >> 0x10);
        auVar24[2] = -(cStack_2a6 == cVar21);
        bVar22 = (byte)((uint)uVar2 >> 0x18);
        auVar24[3] = -(bStack_2a5 == bVar22);
        auVar24[4] = -(cStack_2a4 == cVar18);
        auVar24[5] = -(cStack_2a3 == cVar20);
        auVar24[6] = -(cStack_2a2 == cVar21);
        auVar24[7] = -(bStack_2a1 == bVar22);
        auVar24[8] = -(cStack_2a0 == cVar18);
        auVar24[9] = -(cStack_29f == cVar20);
        auVar24[10] = -(cStack_29e == cVar21);
        auVar24[0xb] = -(bStack_29d == bVar22);
        auVar24[0xc] = -(cStack_29c == cVar18);
        auVar24[0xd] = -(cStack_29b == cVar20);
        auVar24[0xe] = -(cStack_29a == cVar21);
        auVar24[0xf] = -(bStack_299 == bVar22);
        uVar15 = (uint)(ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe);
        if (uVar15 != 0) {
          do {
            uVar3 = 0;
            if (uVar15 != 0) {
              for (; (uVar15 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
              }
            }
            if (local_3a8 == *(DefineDirectiveSyntax **)(uVar13 * 0x78 + (ulong)uVar3 * 8))
            goto LAB_0020d11f;
            uVar15 = uVar15 - 1 & uVar15;
          } while (uVar15 != 0);
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)src & 7] & bStack_299) == 0) break;
        uVar16 = uVar16 + 1;
        uVar13 = (ulong)((int)uVar13 + (int)uVar16 & 1);
      } while (uVar16 < 2);
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
      ::unchecked_emplace_with_rehash<slang::syntax::DefineDirectiveSyntax_const*const&>
                ((locator *)local_370,
                 (table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
                  *)&local_2e0,(size_t)src,&local_3a8);
      src = extraout_RDX_01;
    }
LAB_0020d11f:
    iVar9 = SmallVectorBase<slang::parsing::Token>::copy
                      ((SmallVectorBase<slang::parsing::Token> *)local_280,
                       (EVP_PKEY_CTX *)this->alloc,src);
    pSVar12 = (Storage *)CONCAT44(extraout_var,iVar9);
    local_370._8_8_ = extraout_RDX_00;
    while (local_370._0_8_ = pSVar12,
          bVar8 = expandReplacementList
                            (this,(span<const_slang::parsing::Token,_18446744073709551615UL> *)
                                  local_370,
                             (SmallSet<const_slang::syntax::DefineDirectiveSyntax_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
                              *)local_328), uVar6 = local_370._0_8_, bVar8) {
      (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.len = 0;
      tokens._M_extent._M_extent_value = local_370._8_8_;
      tokens._M_ptr = (pointer)local_370._0_8_;
      bVar8 = applyMacroOps(this,tokens,
                            &(this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>);
      pMVar10 = local_358;
      if (!bVar8 && pSVar12 == (Storage *)uVar6) {
        if ((this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.len != 0) {
          this->currentMacroToken =
               (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.data_;
        }
        Trivia::Trivia((Trivia *)&local_380);
        __return_storage_ptr__->first = pMVar10;
        (__return_storage_ptr__->second).field_0.rawText.ptr = local_380.rawText.ptr;
        *(undefined8 *)((long)&(__return_storage_ptr__->second).field_0 + 8) =
             stack0xfffffffffffffc88;
        goto LAB_0020d23f;
      }
      pSVar12 = (Storage *)(this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.data_
      ;
      local_370._8_8_ = (this->expandedTokens).super_SmallVectorBase<slang::parsing::Token>.len;
    }
    Trivia::Trivia((Trivia *)&local_380);
    __return_storage_ptr__->first = local_358;
    (__return_storage_ptr__->second).field_0.rawText.ptr = local_380.rawText.ptr;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).field_0 + 8) = stack0xfffffffffffffc88;
LAB_0020d23f:
    local_370._0_8_ = local_2e0;
    if ((DefineDirectiveSyntax **)local_2c8._8_8_ != (DefineDirectiveSyntax **)0x0) {
      detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>::
      deallocate((StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL> *)
                 local_370,(DefineDirectiveSyntax **)local_2c8._8_8_,local_2d0 * 0x88 + 0x96U >> 3);
    }
  }
  else {
    Trivia::Trivia((Trivia *)local_328);
    __return_storage_ptr__->first = pMVar10;
    (__return_storage_ptr__->second).field_0.rawText.ptr = (char *)local_328._0_8_;
    *(undefined8 *)((long)&(__return_storage_ptr__->second).field_0 + 8) = local_328._8_8_;
  }
  if (local_280 == (undefined1  [8])local_268) {
    return __return_storage_ptr__;
  }
LAB_0020d292:
  operator_delete((void *)local_280);
  return __return_storage_ptr__;
LAB_0020d5b4:
  bVar8 = peekSameLine(this);
  src_00 = extraout_RDX_02;
  if (!bVar8) goto LAB_0020d5f3;
  TVar41 = peek(this);
  src_00 = TVar41.info;
  if (TVar41.kind == EndOfFile) goto LAB_0020d5f3;
  local_328._0_16_ = (undefined1  [16])consume(this);
  SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token>
            ((SmallVectorBase<slang::parsing::Token> *)local_280,(Token *)local_328);
  goto LAB_0020d5b4;
LAB_0020d5f3:
  if (local_278._M_ptr == (pointer)0x0) {
    Trivia::Trivia((Trivia *)local_328);
  }
  else {
    iVar9 = SmallVectorBase<slang::parsing::Token>::copy
                      ((SmallVectorBase<slang::parsing::Token> *)local_280,
                       (EVP_PKEY_CTX *)this->alloc,(EVP_PKEY_CTX *)src_00);
    tokens_00._M_ptr._4_4_ = extraout_var_00;
    tokens_00._M_ptr._0_4_ = iVar9;
    tokens_00._M_extent._M_extent_value = extraout_RDX_03._M_extent_value;
    Trivia::Trivia((Trivia *)local_328,SkippedTokens,tokens_00);
  }
  __return_storage_ptr__->first = (MacroActualArgumentListSyntax *)0x0;
  (__return_storage_ptr__->second).field_0.rawText.ptr = (char *)local_328._0_8_;
  *(undefined8 *)((long)&(__return_storage_ptr__->second).field_0 + 8) = local_328._8_8_;
  if (local_280 == (undefined1  [8])local_268) {
    return __return_storage_ptr__;
  }
  goto LAB_0020d292;
}

Assistant:

std::pair<MacroActualArgumentListSyntax*, Trivia> Preprocessor::handleTopLevelMacro(
    Token directive) {
    auto macro = findMacro(directive);
    if (!macro.valid()) {
        if (options.ignoreDirectives.find(directive.valueText().substr(1)) !=
            options.ignoreDirectives.end()) {
            SmallVector<Token, 4> ignoreTokens;
            while (peekSameLine() && peek().kind != TokenKind::EndOfFile)
                ignoreTokens.push_back(consume());

            if (ignoreTokens.empty())
                return {nullptr, Trivia()};
            else
                return {nullptr, Trivia(TriviaKind::SkippedTokens, ignoreTokens.copy(alloc))};
        }
        addDiag(diag::UnknownDirective, directive.range()) << directive.valueText();

        // If we see a parenthesis next, let's assume they tried to invoke a function-like macro
        // and skip over the tokens.
        if (peek(TokenKind::OpenParenthesis))
            return {MacroParser(*this).parseActualArgumentList(directive), Trivia()};
        return {nullptr, Trivia()};
    }

    // if this assert fires, we failed to fully expand nested macros at a previous point
    SLANG_ASSERT(!currentMacroToken);

    // parse arguments if necessary
    MacroActualArgumentListSyntax* actualArgs = nullptr;
    if (macro.needsArgs()) {
        actualArgs = MacroParser(*this).parseActualArgumentList(directive);
        if (!actualArgs)
            return {nullptr, Trivia()};
    }

    // Expand out the macro
    SmallVector<Token, 32> buffer;
    MacroExpansion expansion{sourceManager, alloc, buffer, directive, true};
    if (!expandMacro(macro, expansion, actualArgs))
        return {actualArgs, Trivia()};

    // The macro is now expanded out into tokens, but some of those tokens might
    // be more macros that need to be expanded, or special characters that
    // perform stringification or concatenation of tokens. It's possible that
    // after concatentation is performed we will have formed new valid macro
    // names that need to be expanded, which is why we loop here.
    SmallSet<const DefineDirectiveSyntax*, 8> alreadyExpanded;
    if (!macro.isIntrinsic())
        alreadyExpanded.insert(macro.syntax);

    std::span<Token const> tokens = buffer.copy(alloc);
    while (true) {
        // Start by recursively expanding out all valid macro usages. We keep track of
        // the token pointer here so that we can detect if expandReplacementList actually
        // did any work; if it did we want to ensure that we come back around for another
        // pass. This ensures that we don't miss expanding a constructed macro.
        const Token* ptr = tokens.data();
        if (!expandReplacementList(tokens, alreadyExpanded))
            return {actualArgs, Trivia()};

        // Now that all macros have been expanded, handle token concatenation and stringification.
        expandedTokens.clear();
        if (!applyMacroOps(tokens, expandedTokens) && ptr == tokens.data())
            break;

        tokens = expandedTokens;
    }

    // if the macro expanded into any tokens at all, set the pointer
    // so that we'll pull from them next
    if (!expandedTokens.empty())
        currentMacroToken = expandedTokens.begin();

    return {actualArgs, Trivia()};
}